

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::CameraBaseParameters::CameraBaseParameters
          (CameraBaseParameters *this,CameraTransform *cameraTransform,Film *film,Medium *medium,
          ParameterDictionary *parameters,FileLoc *loc)

{
  void *in_RSI;
  void *in_RDI;
  ParameterDictionary *in_R8;
  Float FVar1;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  ParameterDictionary *in_stack_ffffffffffffff30;
  ParameterDictionary *__a;
  allocator<char> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  FileLoc *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [40];
  ParameterDictionary *local_28;
  
  local_28 = in_R8;
  memcpy(in_RDI,in_RSI,0x338);
  *(undefined4 *)((long)in_RDI + 0x338) = 0;
  *(undefined4 *)((long)in_RDI + 0x33c) = 0x3f800000;
  Film::Film((Film *)in_stack_ffffffffffffff30,
             (Film *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Medium::Medium((Medium *)in_stack_ffffffffffffff30,
                 (Medium *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  args_1 = &local_51;
  __a = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)args_1,(allocator<char> *)__a);
  FVar1 = ParameterDictionary::GetOneFloat
                    (in_stack_ffffffffffffff30,
                     (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0.0);
  *(Float *)((long)in_RDI + 0x338) = FVar1;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)args_1,(allocator<char> *)__a);
  FVar1 = ParameterDictionary::GetOneFloat
                    (local_28,(string *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0.0);
  *(Float *)((long)in_RDI + 0x33c) = FVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  if (*(float *)((long)in_RDI + 0x33c) < *(float *)((long)in_RDI + 0x338)) {
    Warning<float&,float&>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (float *)in_stack_ffffffffffffff70,(float *)args_1);
    pstd::swap<float>((float *)((long)in_RDI + 0x33c),(float *)((long)in_RDI + 0x338));
  }
  return;
}

Assistant:

CameraBaseParameters::CameraBaseParameters(const CameraTransform &cameraTransform,
                                           Film film, Medium medium,
                                           const ParameterDictionary &parameters,
                                           const FileLoc *loc)
    : cameraTransform(cameraTransform), film(film), medium(medium) {
    shutterOpen = parameters.GetOneFloat("shutteropen", 0.f);
    shutterClose = parameters.GetOneFloat("shutterclose", 1.f);
    if (shutterClose < shutterOpen) {
        Warning(loc, "Shutter close time %f < shutter open %f.  Swapping them.",
                shutterClose, shutterOpen);
        pstd::swap(shutterClose, shutterOpen);
    }
}